

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan_mock.cpp
# Opt level: O2

VkResult shim_vkEnumerateDeviceExtensionProperties
                   (VkPhysicalDevice physicalDevice,char *pLayerName,uint32_t *pPropertyCount,
                   VkExtensionProperties *pProperties)

{
  int iVar1;
  VkResult VVar2;
  long lVar3;
  PhysicalDeviceDetails *pPVar4;
  long lVar5;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *data_vec;
  pointer __s1;
  bool bVar6;
  _Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> local_48;
  
  if (pLayerName == (char *)0x0) {
    pPVar4 = get_physical_device_details(physicalDevice);
    data_vec = &pPVar4->extensions;
  }
  else {
    lVar3 = ((long)mock.instance_layers.
                   super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl
                   .super__Vector_impl_data._M_finish -
            (long)mock.instance_layers.
                  super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
                  super__Vector_impl_data._M_start) / 0x208;
    lVar5 = 0;
    __s1 = mock.instance_layers.
           super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
           super__Vector_impl_data._M_start;
    while( true ) {
      bVar6 = lVar3 == 0;
      lVar3 = lVar3 + -1;
      if (bVar6) {
        local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        VVar2 = fill_out_count_pointer_pair<VkExtensionProperties>
                          ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
                           &local_48,pPropertyCount,pProperties);
        std::_Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::
        ~_Vector_base(&local_48);
        return VVar2;
      }
      iVar1 = strcmp(__s1->layerName,pLayerName);
      if (iVar1 == 0) break;
      lVar5 = lVar5 + -0x18;
      __s1 = __s1 + 1;
    }
    data_vec = (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
               ((long)mock.per_layer_device_extension_properties.
                      super__Vector_base<std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>,_std::allocator<std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start - lVar5);
  }
  VVar2 = fill_out_count_pointer_pair<VkExtensionProperties>(data_vec,pPropertyCount,pProperties);
  return VVar2;
}

Assistant:

VKAPI_ATTR VkResult VKAPI_CALL shim_vkEnumerateDeviceExtensionProperties(
    VkPhysicalDevice physicalDevice, const char* pLayerName, uint32_t* pPropertyCount, VkExtensionProperties* pProperties) {
    if (pLayerName) {
        for (size_t i = 0; i < mock.instance_layers.size(); i++) {
            if (strcmp(mock.instance_layers[i].layerName, pLayerName) == 0) {
                return fill_out_count_pointer_pair(mock.per_layer_device_extension_properties[i], pPropertyCount, pProperties);
            }
        }
        // Layer not found, fill out with empty list
        return fill_out_count_pointer_pair({}, pPropertyCount, pProperties);
    }
    return fill_out_count_pointer_pair(get_physical_device_details(physicalDevice).extensions, pPropertyCount, pProperties);
}